

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall AbstractTaskProvider::AbstractTaskProvider(AbstractTaskProvider *this)

{
  atomic<unsigned_long> *in_RDI;
  __integral_type in_stack_ffffffffffffffe8;
  
  (in_RDI->super___atomic_base<unsigned_long>)._M_i =
       (__int_type)&PTR__AbstractTaskProvider_00217c78;
  std::atomic<unsigned_long>::atomic(in_RDI,in_stack_ffffffffffffffe8);
  std::atomic<unsigned_long>::atomic(in_RDI,in_stack_ffffffffffffffe8);
  std::atomic<unsigned_long>::atomic(in_RDI,in_stack_ffffffffffffffe8);
  *(undefined1 *)&in_RDI[4].super___atomic_base<unsigned_long>._M_i = 0;
  std::mutex::mutex((mutex *)0x12f9c4);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 10));
  *(undefined1 *)&in_RDI[0x10].super___atomic_base<unsigned_long>._M_i = 0;
  return;
}

Assistant:

AbstractTaskProvider::AbstractTaskProvider()
    : _taskCount         ( 0 )
    , _givenTaskCount    ( 0 )
    , _completedTaskCount( 0 )
    , _running           ( false )
    , _exceptionRaised   ( false )
{
}